

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# files.cpp
# Opt level: O3

longdouble * __thiscall
BMP::byteSizeCode(longdouble *__return_storage_ptr__,BMP *this,typeOfCode type)

{
  longdouble *in_RAX;
  longdouble *extraout_RAX;
  longdouble *extraout_RAX_00;
  longdouble *extraout_RAX_01;
  longdouble *extraout_RAX_02;
  longdouble *extraout_RAX_03;
  longdouble *extraout_RAX_04;
  longdouble *extraout_RAX_05;
  longdouble *extraout_RAX_06;
  longdouble *extraout_RAX_07;
  long lVar1;
  int iVar2;
  long lVar3;
  undefined1 *local_a8;
  longdouble *local_a0;
  undefined1 local_98 [16];
  undefined1 *local_88;
  longdouble *local_80;
  undefined1 local_78 [16];
  undefined1 *local_68;
  longdouble *local_60;
  undefined1 local_58 [16];
  longdouble *local_48;
  longdouble *local_40;
  longdouble *local_38;
  
  iVar2 = (int)this;
  if (iVar2 == 0) {
    in_RAX = *(longdouble **)(__return_storage_ptr__ + 0x45);
    if ((long)*(int *)in_RAX != 0) {
      lVar1 = *(long *)((long)in_RAX + 8);
      lVar3 = (long)*(int *)in_RAX * 0x80 + lVar1;
      do {
        local_a8 = local_98;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_a8,*(long *)(lVar1 + 0x20),
                   *(long *)(lVar1 + 0x28) + *(long *)(lVar1 + 0x20));
        local_88 = local_78;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_88,*(long *)(lVar1 + 0x40),
                   *(long *)(lVar1 + 0x48) + *(long *)(lVar1 + 0x40));
        local_68 = local_58;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_68,*(long *)(lVar1 + 0x60),
                   *(long *)(lVar1 + 0x68) + *(long *)(lVar1 + 0x60));
        local_40 = local_a0;
        in_RAX = local_a0;
        if (local_68 != local_58) {
          operator_delete(local_68);
          in_RAX = extraout_RAX_05;
        }
        if (local_88 != local_78) {
          operator_delete(local_88);
          in_RAX = extraout_RAX_06;
        }
        if (local_a8 != local_98) {
          operator_delete(local_a8);
          in_RAX = extraout_RAX_07;
        }
        lVar1 = lVar1 + 0x80;
      } while (lVar1 != lVar3);
    }
  }
  else if (iVar2 == 1) {
    in_RAX = *(longdouble **)(__return_storage_ptr__ + 0x45);
    if ((long)*(int *)in_RAX != 0) {
      lVar1 = *(long *)((long)in_RAX + 8);
      lVar3 = (long)*(int *)in_RAX * 0x80 + lVar1;
      do {
        local_a8 = local_98;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_a8,*(long *)(lVar1 + 0x20),
                   *(long *)(lVar1 + 0x28) + *(long *)(lVar1 + 0x20));
        local_88 = local_78;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_88,*(long *)(lVar1 + 0x40),
                   *(long *)(lVar1 + 0x48) + *(long *)(lVar1 + 0x40));
        local_68 = local_58;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_68,*(long *)(lVar1 + 0x60),
                   *(long *)(lVar1 + 0x68) + *(long *)(lVar1 + 0x60));
        local_38 = local_60;
        in_RAX = local_60;
        if (local_68 != local_58) {
          operator_delete(local_68);
          in_RAX = extraout_RAX_02;
        }
        if (local_88 != local_78) {
          operator_delete(local_88);
          in_RAX = extraout_RAX_03;
        }
        if (local_a8 != local_98) {
          operator_delete(local_a8);
          in_RAX = extraout_RAX_04;
        }
        lVar1 = lVar1 + 0x80;
      } while (lVar1 != lVar3);
    }
  }
  else if (iVar2 == 2) {
    in_RAX = *(longdouble **)(__return_storage_ptr__ + 0x45);
    if ((long)*(int *)in_RAX != 0) {
      lVar1 = *(long *)((long)in_RAX + 8);
      lVar3 = (long)*(int *)in_RAX * 0x80 + lVar1;
      do {
        local_a8 = local_98;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_a8,*(long *)(lVar1 + 0x20),
                   *(long *)(lVar1 + 0x28) + *(long *)(lVar1 + 0x20));
        local_88 = local_78;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_88,*(long *)(lVar1 + 0x40),
                   *(long *)(lVar1 + 0x48) + *(long *)(lVar1 + 0x40));
        local_68 = local_58;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_68,*(long *)(lVar1 + 0x60),
                   *(long *)(lVar1 + 0x68) + *(long *)(lVar1 + 0x60));
        local_48 = local_80;
        in_RAX = local_80;
        if (local_68 != local_58) {
          operator_delete(local_68);
          in_RAX = extraout_RAX;
        }
        if (local_88 != local_78) {
          operator_delete(local_88);
          in_RAX = extraout_RAX_00;
        }
        if (local_a8 != local_98) {
          operator_delete(local_a8);
          in_RAX = extraout_RAX_01;
        }
        lVar1 = lVar1 + 0x80;
      } while (lVar1 != lVar3);
    }
  }
  return in_RAX;
}

Assistant:

long double BMP::byteSizeCode( typeOfCode type )
{
    using namespace std;
    using namespace bitMap;
    long double temp = 0;

    switch( type ){
        case SHANNON:
            for_each( alphabet->symbol, alphabet->symbol+alphabet->num, [ & ]( GreyCount a ){
                temp += ( a.frq * a.codeShannonFano.size() );
            });
            break;
        case UNIFORM:
            for_each( alphabet->symbol, alphabet->symbol+alphabet->num, [ & ]( GreyCount a ){
                temp += ( a.frq * a.uniformCodes.size() );
            });
            break;
        case HUFFMAN:
            for_each( alphabet->symbol, alphabet->symbol+alphabet->num, [ & ]( GreyCount a ){
                temp += ( a.frq * a.codeHuffman.size() );
            });
            break;
    }
    return temp;
}